

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractInt::test
          (ShaderBitfieldOperationCaseBitfieldExtractInt *this,Data *data)

{
  char cVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)this->m_components;
  if ((long)uVar5 < 1) {
    return true;
  }
  cVar2 = (char)data->bits;
  cVar1 = (char)data->offset + cVar2;
  if (data->outIvec4[0] != (data->inIvec4[0] << (-cVar1 & 0x1fU)) >> (-cVar2 & 0x1fU)) {
    return false;
  }
  lVar3 = 0;
  do {
    lVar4 = lVar3;
    if (uVar5 - 1 == lVar4) break;
    lVar3 = lVar4 + 1;
  } while (data->outIvec4[lVar4 + 1] ==
           (data->inIvec4[lVar4 + 1] << (0x20U - cVar1 & 0x1f)) >> (0x20U - cVar2 & 0x1f));
  return uVar5 <= lVar4 + 1U;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected = data->inIvec4[i] << (32 - (data->offset + data->bits));
			expected >>= 32 - data->bits;
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}